

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O3

Resource * __thiscall tcu::ResourcePrefix::getResource(ResourcePrefix *this,char *name)

{
  Archive *pAVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_40 [2];
  long local_30 [2];
  
  pAVar1 = this->m_archive;
  pcVar2 = (this->m_prefix)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar2,pcVar2 + (this->m_prefix)._M_string_length);
  std::__cxx11::string::append((char *)local_40);
  iVar3 = (*pAVar1->_vptr_Archive[2])(pAVar1,local_40[0]);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return (Resource *)CONCAT44(extraout_var,iVar3);
}

Assistant:

Resource* ResourcePrefix::getResource (const char* name) const
{
	return m_archive.getResource((m_prefix + name).c_str());
}